

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O0

Reals __thiscall
Omega_h::coarsen_qualities(Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  Omega_h_Parting OVar1;
  LO nmetrics;
  Int IVar2;
  Int IVar3;
  void *extraout_RDX;
  Reals RVar4;
  Write<int> local_190;
  Read<int> local_180;
  Read<int> local_170;
  Read<int> local_160;
  undefined1 local_150 [8];
  Write<int> cands2verts;
  LOs edges2verts;
  Read<int> local_120;
  Read<signed_char> local_110;
  Read<int> local_100;
  Read<signed_char> local_f0;
  Read<int> local_e0;
  undefined4 local_cc;
  Read<signed_char> local_c8;
  Read<int> local_b8;
  undefined1 local_a8 [8];
  Reals cand_quals;
  Int metric_dim;
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  Read<double> metrics;
  Read<signed_char> *cand_codes_local;
  LOs *cands2edges_local;
  Mesh *mesh_local;
  
  metrics.write_.shared_alloc_.direct_ptr = cand_codes;
  OVar1 = Mesh::parting(mesh);
  if (OVar1 != OMEGA_H_GHOSTED) {
    fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_qualities.cpp"
         ,0x42);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"metric",&local_71);
  Mesh::get_array<double>((Mesh *)local_50,(Int)mesh,(string *)0x0);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  nmetrics = Mesh::nverts(mesh);
  Read<double>::Read((Read<double> *)&cand_quals.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_50);
  IVar2 = get_metrics_dim(nmetrics,(Reals *)&cand_quals.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&cand_quals.write_.shared_alloc_.direct_ptr);
  local_a8 = (undefined1  [8])0x0;
  cand_quals.write_.shared_alloc_.alloc = (Alloc *)0x0;
  IVar3 = Mesh::dim(mesh);
  if ((IVar3 == 3) && (IVar2 == 3)) {
    Read<int>::Read(&local_b8,cands2edges);
    Read<signed_char>::Read(&local_c8,cand_codes);
    coarsen_qualities_tmpl<3,3>(this,mesh,&local_b8,&local_c8);
    Read<signed_char>::~Read(&local_c8);
    Read<int>::~Read(&local_b8);
    local_cc = 1;
  }
  else {
    IVar3 = Mesh::dim(mesh);
    if ((IVar3 == 2) && (IVar2 == 2)) {
      Read<int>::Read(&local_e0,cands2edges);
      Read<signed_char>::Read(&local_f0,cand_codes);
      coarsen_qualities_tmpl<2,2>(this,mesh,&local_e0,&local_f0);
      Read<signed_char>::~Read(&local_f0);
      Read<int>::~Read(&local_e0);
      local_cc = 1;
    }
    else {
      IVar3 = Mesh::dim(mesh);
      if ((IVar3 == 3) && (IVar2 == 1)) {
        Read<int>::Read(&local_100,cands2edges);
        Read<signed_char>::Read(&local_110,cand_codes);
        coarsen_qualities_tmpl<3,1>(this,mesh,&local_100,&local_110);
        Read<signed_char>::~Read(&local_110);
        Read<int>::~Read(&local_100);
        local_cc = 1;
      }
      else {
        IVar3 = Mesh::dim(mesh);
        if ((IVar3 == 2) && (IVar2 == 1)) {
          Read<int>::Read(&local_120,cands2edges);
          Read<signed_char>::Read
                    ((Read<signed_char> *)&edges2verts.write_.shared_alloc_.direct_ptr,cand_codes);
          coarsen_qualities_tmpl<2,1>
                    (this,mesh,&local_120,
                     (Read<signed_char> *)&edges2verts.write_.shared_alloc_.direct_ptr);
          Read<signed_char>::~Read
                    ((Read<signed_char> *)&edges2verts.write_.shared_alloc_.direct_ptr);
          Read<int>::~Read(&local_120);
          local_cc = 1;
        }
        else {
          IVar2 = Mesh::dim(mesh);
          if (IVar2 != 1) {
            fail("assertion %s failed at %s +%d\n","false",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_qualities.cpp"
                 ,0x57);
          }
          Mesh::ask_verts_of((Mesh *)&cands2verts.shared_alloc_.direct_ptr,(Int)mesh);
          Read<int>::Read(&local_160,cands2edges);
          Read<int>::Read(&local_170,(Read<int> *)&cands2verts.shared_alloc_.direct_ptr);
          unmap<int>((Omega_h *)local_150,&local_160,&local_170,2);
          Read<int>::~Read(&local_170);
          Read<int>::~Read(&local_160);
          Write<int>::Write(&local_190,(Write<int> *)local_150);
          Read<int>::Read(&local_180,&local_190);
          get_1d_cavity_qualities(this,mesh,0,&local_180);
          Read<int>::~Read(&local_180);
          Write<int>::~Write(&local_190);
          local_cc = 1;
          Write<int>::~Write((Write<int> *)local_150);
          Read<int>::~Read((Read<int> *)&cands2verts.shared_alloc_.direct_ptr);
        }
      }
    }
  }
  Read<double>::~Read((Read<double> *)local_a8);
  Read<double>::~Read((Read<double> *)local_50);
  RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals coarsen_qualities(Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  auto metrics = mesh->get_array<Real>(VERT, "metric");
  auto metric_dim = get_metrics_dim(mesh->nverts(), metrics);
  auto cand_quals = Reals();
  if (mesh->dim() == 3 && metric_dim == 3) {
    return coarsen_qualities_tmpl<3, 3>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 2 && metric_dim == 2) {
    return coarsen_qualities_tmpl<2, 2>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 3 && metric_dim == 1) {
    return coarsen_qualities_tmpl<3, 1>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 2 && metric_dim == 1) {
    return coarsen_qualities_tmpl<2, 1>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 1) {
    auto edges2verts = mesh->ask_verts_of(EDGE);
    auto cands2verts = unmap(cands2edges, edges2verts, 2);
    return get_1d_cavity_qualities(mesh, VERT, cands2verts);
  }
  OMEGA_H_NORETURN(Reals());
}